

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

uint __thiscall ON_V4V5_MeshNgonList::V4V5_SizeOf(ON_V4V5_MeshNgonList *this)

{
  long lVar1;
  int iVar2;
  
  if ((long)this->m_ngons_count < 1) {
    iVar2 = 0x18;
  }
  else {
    lVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + *(int *)((long)&this->m_ngons->N + lVar1) * 2;
      lVar1 = lVar1 + 0x18;
    } while ((long)this->m_ngons_count * 0x18 != lVar1);
    iVar2 = iVar2 * 4 + 0x18;
  }
  return iVar2 + this->m_ngons_capacity * 0x18;
}

Assistant:

unsigned int ON_V4V5_MeshNgonList::V4V5_SizeOf() const
{
  unsigned int sz = sizeof(*this);
  int icount = 0;
  for ( int i = 0; i < m_ngons_count; i++ )
  {
    icount += 2*m_ngons[i].N;
  }
  sz += m_ngons_capacity*sizeof(m_ngons[0]);
  sz += icount*sizeof(int);
  return sz;
}